

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int SaveCfgublox(UBLOX *publox)

{
  int iVar1;
  uchar local_49 [4];
  uint local_45;
  CFG_CFG_PL_UBX cfg_cfg_pl;
  int sendbuflen;
  uchar sendbuf [32];
  UBLOX *publox_local;
  
  cfg_cfg_pl.saveMask._1_3_ = 0;
  cfg_cfg_pl.loadMask._0_1_ = 0;
  memset(local_49,0,0xd);
  local_45 = local_45 & 0xffffe0e0 | 0x1f1f;
  cfg_cfg_pl.saveMask._0_1_ = cfg_cfg_pl.saveMask._0_1_ & 0xe8 | 0x17;
  EncodePacketUBX(&cfg_cfg_pl.loadMask.field_0x1,(int *)&cfg_cfg_pl.saveMask.field_0x1,6,9,local_49,
                  0xd);
  iVar1 = WriteAllRS232Port(&publox->RS232Port,&cfg_cfg_pl.loadMask.field_0x1,cfg_cfg_pl._5_4_);
  if (iVar1 == 0) {
    if ((publox->bSaveRawData != 0) && (publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(&cfg_cfg_pl.loadMask.field_0x1,(long)(int)cfg_cfg_pl._5_4_,1,(FILE *)publox->pfSaveFile
            );
      fflush((FILE *)publox->pfSaveFile);
    }
    publox_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a ublox. \n");
    publox_local._4_4_ = 1;
  }
  return publox_local._4_4_;
}

Assistant:

inline int SaveCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[32];
	int sendbuflen = 0;
	struct CFG_CFG_PL_UBX cfg_cfg_pl;

	memset(&cfg_cfg_pl, 0, sizeof(cfg_cfg_pl));	
	cfg_cfg_pl.saveMask.ioPort = 1;
	cfg_cfg_pl.saveMask.msgConf = 1;
	cfg_cfg_pl.saveMask.infMsg = 1;
	cfg_cfg_pl.saveMask.navConf = 1;
	cfg_cfg_pl.saveMask.rxmConf = 1;
	cfg_cfg_pl.saveMask.senConf = 1;
	cfg_cfg_pl.saveMask.rinvConf = 1;
	cfg_cfg_pl.saveMask.antConf = 1;
	cfg_cfg_pl.saveMask.logConf = 1;
	cfg_cfg_pl.saveMask.ftsConf = 1;
	cfg_cfg_pl.deviceMask.devBBR = 1;
	cfg_cfg_pl.deviceMask.devFlash = 1;
	cfg_cfg_pl.deviceMask.devEEPROM = 1;
	cfg_cfg_pl.deviceMask.devSpiFlash = 1;
	EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, LEN_CFG_CFG_PL_UBX);
	//EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, sizeof(cfg_cfg_pl));

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}